

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

CBNode * __thiscall asmjit::CodeBuilder::addBefore(CodeBuilder *this,CBNode *node,CBNode *ref)

{
  CBNode *pCVar1;
  CBNode *in_RDX;
  CBNode *in_RSI;
  long in_RDI;
  CBNode *next;
  CBNode *prev;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  
  if (in_RSI == (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (in_RSI->_prev != (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (in_RSI->_next != (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (in_RDX == (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  pCVar1 = in_RDX->_prev;
  in_RSI->_prev = pCVar1;
  in_RSI->_next = in_RDX;
  in_RDX->_prev = in_RSI;
  if (pCVar1 == (CBNode *)0x0) {
    *(CBNode **)(in_RDI + 0x170) = in_RSI;
  }
  else {
    pCVar1->_next = in_RSI;
  }
  return in_RSI;
}

Assistant:

CBNode* CodeBuilder::addBefore(CBNode* node, CBNode* ref) noexcept {
  ASMJIT_ASSERT(node != nullptr);
  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);
  ASMJIT_ASSERT(ref != nullptr);

  CBNode* prev = ref->_prev;
  CBNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _firstNode = node;

  return node;
}